

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O1

char * macro_GetAllArgs(void)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  MacroArgs *pMVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *__dest;
  uint32_t i;
  ulong uVar10;
  
  pMVar3 = macroArgs;
  if (macroArgs == (MacroArgs *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    uVar1 = macroArgs->nbArgs;
    uVar2 = macroArgs->shift;
    uVar9 = (ulong)uVar2;
    if (uVar2 < uVar1) {
      lVar8 = 0;
      uVar10 = uVar9;
      do {
        sVar4 = strlen(*(char **)(&pMVar3[1].nbArgs + uVar10 * 2));
        lVar7 = lVar8 + sVar4;
        lVar8 = lVar7 + 1;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
      pcVar5 = (char *)malloc(lVar7 + 2);
      if (pcVar5 == (char *)0x0) {
        piVar6 = __errno_location();
        pcVar5 = strerror(*piVar6);
        fatalerror("Failed to allocate memory for expanding \'\\#\': %s\n",pcVar5);
      }
      __dest = pcVar5;
      if (uVar2 < pMVar3->nbArgs) {
        do {
          __s = *(char **)(&pMVar3[1].nbArgs + uVar9 * 2);
          sVar4 = strlen(__s);
          memcpy(__dest,__s,sVar4);
          __dest = __dest + sVar4;
          if ((uVar9 < pMVar3->nbArgs - 1) || (sVar4 == 0)) {
            *__dest = ',';
            __dest = __dest + 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < pMVar3->nbArgs);
      }
      *__dest = '\0';
    }
    else {
      pcVar5 = "";
    }
  }
  return pcVar5;
}

Assistant:

char const *macro_GetAllArgs(void)
{
	if (!macroArgs)
		return NULL;

	if (macroArgs->shift >= macroArgs->nbArgs)
		return "";

	size_t len = 0;

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++)
		len += strlen(macroArgs->args[i]) + 1; // 1 for comma

	char *str = (char *)malloc(len + 1); // 1 for '\0'
	char *ptr = str;

	if (!str)
		fatalerror("Failed to allocate memory for expanding '\\#': %s\n", strerror(errno));

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++) {
		size_t n = strlen(macroArgs->args[i]);

		memcpy(ptr, macroArgs->args[i], n);
		ptr += n;

		// Commas go between args and after a last empty arg
		if (i < macroArgs->nbArgs - 1 || n == 0)
			*ptr++ = ','; // no space after comma
	}
	*ptr = '\0';

	return str;
}